

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O2

bool __thiscall Transformed::intersect(Transformed *this,Ray *ray,Hit *result)

{
  mat4f *mat;
  vec2f vVar1;
  int iVar2;
  mat4f *mat_00;
  vec3f vVar3;
  vec3f vVar4;
  vec3f vVar5;
  vec4f vVar6;
  Hit iresult;
  Ray iray;
  undefined1 local_10c [12];
  vec3f vStack_100;
  vec3f vStack_f4;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float fStack_d8;
  undefined1 auStack_d4 [12];
  mat4f local_c8;
  undefined8 local_88;
  float local_80;
  undefined8 local_7c;
  float local_74;
  mat4f local_70;
  
  mat = &this->invTrans;
  vVar3 = transformedPoint(mat,&ray->origin);
  vVar4 = transformedDir(mat,&ray->dir);
  local_74 = vVar4.z;
  local_7c = vVar4._0_8_;
  local_10c._0_4_ = 0.0;
  local_10c._4_4_ = 0.0;
  stack0xfffffffffffffefc = 0;
  vStack_100.y = 0.0;
  vStack_100.z = 0.0;
  vStack_f4.x = 0.0;
  vStack_f4.y = 0.0;
  auStack_d4._8_4_ = 0.0;
  vStack_f4.z = 0.0;
  fStack_e8 = 0.0;
  fStack_e4 = 0.0;
  fStack_e0 = 0.0;
  fStack_dc = 0.0;
  fStack_d8 = 0.0;
  auStack_d4._0_4_ = 0.0;
  auStack_d4._4_4_ = 0.0;
  local_88 = vVar3._0_8_;
  local_80 = vVar3.z;
  iVar2 = (**this->inner->_vptr_Primitive)();
  if (SUB41(iVar2,0) != false) {
    mat_00 = &this->trans;
    vVar3 = transformedPoint(mat_00,(vec3f *)local_10c);
    transposed(&local_c8,mat);
    vVar4 = transformedDir(&local_c8,&vStack_100);
    transposed(&local_70,mat);
    vVar5 = transformedDir(&local_70,&vStack_f4);
    vVar1.y = fStack_e4;
    vVar1.x = fStack_e8;
    result->hit = true;
    (result->p).x = (float)(int)vVar3._0_8_;
    (result->p).y = (float)(int)((ulong)vVar3._0_8_ >> 0x20);
    (result->p).z = vVar3.z;
    (result->Ns).x = (float)(int)vVar4._0_8_;
    (result->Ns).y = (float)(int)((ulong)vVar4._0_8_ >> 0x20);
    (result->Ns).z = vVar4.z;
    (result->Ng).x = (float)(int)vVar5._0_8_;
    (result->Ng).y = (float)(int)((ulong)vVar5._0_8_ >> 0x20);
    (result->Ng).z = vVar5.z;
    result->uv = vVar1;
    (result->dpdv).y = 0.0;
    (result->dpdv).z = 0.0;
    (result->dpdu).x = 0.0;
    (result->dpdu).y = 0.0;
    *(undefined8 *)&(result->dpdu).z = 0;
    local_c8.data[0][1] = fStack_dc;
    local_c8.data[0][0] = fStack_e0;
    local_c8.data[0][2] = fStack_d8;
    local_c8.data[0][3] = 0.0;
    vVar6 = operator*(mat_00,(vec4f *)&local_c8);
    (result->dpdu).x = (float)(int)vVar6._0_8_;
    (result->dpdu).y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
    (result->dpdu).z = vVar6.z;
    local_c8.data[0][0] = (float)auStack_d4._0_4_;
    local_c8.data[0][1] = (float)auStack_d4._4_4_;
    local_c8.data[0][2] = (float)auStack_d4._8_4_;
    local_c8.data[0][3] = 0.0;
    vVar6 = operator*(mat_00,(vec4f *)&local_c8);
    (result->dpdv).x = (float)(int)vVar6._0_8_;
    (result->dpdv).y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
    (result->dpdv).z = vVar6.z;
  }
  return SUB41(iVar2,0);
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const
	{
		Ray iray(transformedPoint(invTrans, ray.origin), transformedDir(invTrans, ray.dir));
		Hit iresult;
		bool b = inner->intersect(iray, &iresult);
		if (!b) return false;
		*result = Hit(
			transformedPoint(trans, iresult.p),
			transformedDir(transposed(invTrans), iresult.Ns),
			transformedDir(transposed(invTrans), iresult.Ng),
			iresult.uv);
		result->dpdu = (trans * vec4f(iresult.dpdu, 0)).xyz();
		result->dpdv = (trans * vec4f(iresult.dpdv, 0)).xyz();
		return true;
	}